

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::_free_list_add(Tree *this,size_t i)

{
  code *pcVar1;
  bool bVar2;
  error_flags eVar3;
  long lVar4;
  ulong in_RSI;
  long *in_RDI;
  NodeData *w;
  char msg [36];
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  char *in_stack_ffffffffffffff78;
  Location *this_00;
  Location local_38;
  ulong local_10;
  
  local_10 = in_RSI;
  if ((ulong)in_RDI[1] <= in_RSI) {
    memcpy(&local_38,"check failed: (i >= 0 && i < m_cap)",0x24);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = (code *)in_RDI[0xb];
    this_00 = &local_38;
    Location::Location(this_00,in_stack_ffffffffffffff78,
                       CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                       CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    (*pcVar1)(this_00,0x24,in_RDI[8]);
  }
  lVar4 = *in_RDI + local_10 * 0x90;
  *(undefined8 *)(lVar4 + 0x68) = 0xffffffffffffffff;
  *(long *)(lVar4 + 0x80) = in_RDI[3];
  *(undefined8 *)(lVar4 + 0x88) = 0xffffffffffffffff;
  if (in_RDI[3] != -1) {
    *(ulong *)(*in_RDI + in_RDI[3] * 0x90 + 0x88) = local_10;
  }
  in_RDI[3] = local_10;
  if (in_RDI[4] == -1) {
    in_RDI[4] = in_RDI[3];
  }
  return;
}

Assistant:

void Tree::_free_list_add(size_t i)
{
    _RYML_CB_ASSERT(m_callbacks, i >= 0 && i < m_cap);
    NodeData &C4_RESTRICT w = m_buf[i];

    w.m_parent = NONE;
    w.m_next_sibling = m_free_head;
    w.m_prev_sibling = NONE;
    if(m_free_head != NONE)
        m_buf[m_free_head].m_prev_sibling = i;
    m_free_head = i;
    if(m_free_tail == NONE)
        m_free_tail = m_free_head;
}